

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O2

void __thiscall mau::DeliveryChannel::InsertQueueNode(DeliveryChannel *this,QueueNode *node)

{
  PCGRandom *this_00;
  DeliveryCommonData *pDVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  QueueNode *node_00;
  uint uVar7;
  undefined4 uVar8;
  undefined4 extraout_var;
  char cVar9;
  undefined8 unaff_RBP;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  Locker locker_1;
  Locker locker;
  MauChannelConfig config;
  Locker local_90;
  undefined1 local_88 [16];
  Locker local_78;
  MauChannelConfig_t local_6c;
  
  auVar13 = in_ZMM1._0_16_;
  auVar11 = in_ZMM0._0_16_;
  LockedValue<MauChannelConfig_t>::Get(&local_6c,&this->Common->ChannelConfig);
  local_78.TheLock = &this->InsertLock;
  std::recursive_mutex::lock(&(local_78.TheLock)->cs);
  uVar5 = GetTimeUsec();
  auVar11 = vcvtusi2ss_avx512f(auVar11,node->Bytes);
  auVar12._0_4_ = auVar11._0_4_ / local_6c.Router_MBPS;
  auVar12._4_12_ = auVar11._4_12_;
  uVar6 = uVar5 + local_6c.LightSpeedMsec * 1000;
  uVar8 = vcvttss2usi_avx512f(auVar12);
  if (this->NextQueueSlotUsec < uVar6) {
    uVar5 = uVar6 + CONCAT44(extraout_var,uVar8);
    fVar10 = 0.0;
LAB_0010cf2c:
    if (((local_6c.Router_RED_QueueFraction != 0.0) || (NAN(local_6c.Router_RED_QueueFraction))) &&
       (local_6c.Router_RED_QueueFraction < fVar10)) {
      local_88._0_4_ =
           ((fVar10 - local_6c.Router_RED_QueueFraction) * local_6c.Router_RED_MaxPLR) /
           (1.0 - local_6c.Router_RED_QueueFraction);
      uVar3 = PCGRandom::Next(&this->LossRNG);
      uVar7 = vcvttss2usi_avx512f(ZEXT416((uint)((float)local_88._0_4_ * 4.2949673e+09)));
      if (uVar3 < uVar7) {
        pDVar1 = this->Common;
        local_90.TheLock = &(pDVar1->ReadBufferAllocator).AllocatorLock;
        std::recursive_mutex::lock(&(local_90.TheLock)->cs);
        pktalloc::Allocator::Free(&(pDVar1->ReadBufferAllocator).Allocator,(uint8_t *)node);
        goto LAB_0010d14f;
      }
    }
    this_00 = &this->LossRNG;
    uVar3 = PCGRandom::Next(this_00);
    uVar7 = vcvttss2usi_avx512f(ZEXT416((uint)(local_6c.DuplicateRate * 4.2949673e+09)));
    uVar6 = CONCAT71((int7)((ulong)unaff_RBP >> 8),uVar3 < uVar7);
    local_88 = ZEXT416((uint)(this->InBurstReorder & 1) * (int)(1.0 - local_6c.OrderRate) +
                       (uint)!(bool)(this->InBurstReorder & 1) * (int)local_6c.ReorderRate);
    uVar3 = PCGRandom::Next(this_00);
    uVar7 = vcvttss2usi_avx512f(ZEXT416((uint)((float)local_88._0_4_ * 4.2949673e+09)));
    if (uVar3 < uVar7) {
      this->InBurstReorder = true;
      local_88._0_4_ = (int)uVar6;
      if (local_6c.ReorderMaximumLatencyMsec - local_6c.ReorderMinimumLatencyMsec != 0) {
        uVar3 = PCGRandom::Next(this_00);
        local_6c.ReorderMinimumLatencyMsec =
             local_6c.ReorderMinimumLatencyMsec +
             uVar3 % (local_6c.ReorderMaximumLatencyMsec - local_6c.ReorderMinimumLatencyMsec);
      }
      uVar6 = (ulong)(uint)local_88._0_4_;
      uVar3 = local_6c.ReorderMinimumLatencyMsec;
    }
    else {
      uVar3 = 0;
      this->InBurstReorder = false;
    }
    cVar9 = (char)uVar6;
    local_88 = ZEXT416((uint)(this->InBurstLoss & 1) * (int)(1.0 - local_6c.DeliveryRate) +
                       (uint)!(bool)(this->InBurstLoss & 1) * (int)local_6c.LossRate);
    uVar4 = PCGRandom::Next(this_00);
    uVar7 = vcvttss2usi_avx512f(ZEXT416((uint)((float)local_88._0_4_ * 4.2949673e+09)));
    if (uVar4 < uVar7) {
      this->InBurstLoss = true;
      pDVar1 = this->Common;
      local_90.TheLock = &(pDVar1->ReadBufferAllocator).AllocatorLock;
      std::recursive_mutex::lock(&(local_90.TheLock)->cs);
      pktalloc::Allocator::Free(&(pDVar1->ReadBufferAllocator).Allocator,(uint8_t *)node);
      Locker::~Locker(&local_90);
      bVar2 = false;
    }
    else {
      this->InBurstLoss = false;
      uVar4 = PCGRandom::Next(this_00);
      uVar7 = vcvttss2usi_avx512f(ZEXT416((uint)(local_6c.CorruptionRate * 4.2949673e+09)));
      if (uVar4 < uVar7) {
        uVar4 = PCGRandom::Next(this_00);
        node->Data[(ulong)uVar4 % (ulong)node->Bytes] =
             node->Data[(ulong)uVar4 % (ulong)node->Bytes] ^ 8;
      }
      if (uVar3 == 0) {
        this->NextQueueSlotUsec = uVar5;
      }
      else {
        uVar5 = uVar5 + uVar3 * 1000;
      }
      bVar2 = true;
      node->DeliveryUsec = uVar5;
    }
  }
  else {
    uVar5 = this->NextQueueSlotUsec + CONCAT44(extraout_var,uVar8);
    if (uVar5 < local_6c.Router_QueueMsec * 1000 + uVar6) {
      auVar12 = vcvtusi2ss_avx512f(auVar13,uVar5 - uVar6);
      auVar11 = vcvtusi2ss_avx512f(auVar13,local_6c.Router_QueueMsec * 1000);
      fVar10 = auVar12._0_4_ / auVar11._0_4_;
      goto LAB_0010cf2c;
    }
    pDVar1 = this->Common;
    local_90.TheLock = &(pDVar1->ReadBufferAllocator).AllocatorLock;
    std::recursive_mutex::lock(&(local_90.TheLock)->cs);
    pktalloc::Allocator::Free(&(pDVar1->ReadBufferAllocator).Allocator,(uint8_t *)node);
LAB_0010d14f:
    Locker::~Locker(&local_90);
    bVar2 = false;
    cVar9 = '\0';
  }
  Locker::~Locker(&local_78);
  if (bVar2) {
    local_90.TheLock = &this->QueueLock;
    std::recursive_mutex::lock(&(local_90.TheLock)->cs);
    PacketQueue::InsertSorted(&this->Queue,node);
    Locker::~Locker(&local_90);
    if (cVar9 != '\0') {
      pDVar1 = this->Common;
      uVar3 = node->Bytes;
      local_90.TheLock = &(pDVar1->ReadBufferAllocator).AllocatorLock;
      std::recursive_mutex::lock(&(local_90.TheLock)->cs);
      node_00 = (QueueNode *)
                pktalloc::Allocator::Allocate(&(pDVar1->ReadBufferAllocator).Allocator,uVar3 + 0x1c)
      ;
      Locker::~Locker(&local_90);
      node_00->Bytes = node->Bytes;
      memcpy(node_00->Data,node->Data,(ulong)node->Bytes);
      InsertQueueNode(this,node_00);
    }
    postNextTimer(this);
  }
  return;
}

Assistant:

void DeliveryChannel::InsertQueueNode(QueueNode* node)
{
    /*
        Client <-> Internet Delay <-> ISP Router Queue <-> Server

        Most queues are going to be on the receiver ISP side, for example
        on the cellphone network or cable ISP.  The Internet transmission
        delay comes before that.  Since this is the most common case for
        the protocols we are testing, we use the simplified model above.

        In this model, packets put into the queue are subjected to:
        (1) Internet Delay
        (2) ISP Router Queue

        The Internet Delay may vary on route changes.

        The Internet Service Provider (ISP) Router Queue causes
        delays and packet loss if the queue is too full.
    */

    MauChannelConfig config = Common->ChannelConfig.Get();
    bool dupe = false;

    // Hold InsertLock while processing insert
    {
        Locker locker(InsertLock);

        const uint64_t nowUsec = GetTimeUsec();

        const unsigned routerQueueUsec = config.Router_QueueMsec * 1000;
        const uint64_t routerQueueStartUsec = nowUsec + config.LightSpeedMsec * 1000;
        const unsigned dataDelayUsec = (unsigned)(node->Bytes / config.Router_MBPS);

        uint64_t deliveryUsec = 0;
        float queueFraction = 0.f;

        // Calculate delivery time based on router queue
        if (NextQueueSlotUsec < routerQueueStartUsec) {
            deliveryUsec = routerQueueStartUsec + dataDelayUsec;
        }
        else {
            deliveryUsec = NextQueueSlotUsec + dataDelayUsec;

            // DropTail if packet does not fit in router queue
            if (deliveryUsec >= routerQueueStartUsec + routerQueueUsec) {
                Common->ReadBufferAllocator.Free(node);
                return;
            }

            queueFraction = (deliveryUsec - routerQueueStartUsec) / (float)routerQueueUsec;
        }

        // If RED is triggered:
        if (config.Router_RED_QueueFraction != 0.f && queueFraction > config.Router_RED_QueueFraction)
        {
            // Rescale:
            const float red_plr = config.Router_RED_MaxPLR * (queueFraction - config.Router_RED_QueueFraction) / (1.f - config.Router_RED_QueueFraction);

            // If RED drop is needed:
            if (LossRNG.Next() < (uint32_t)(0xffffffff * red_plr)) {
                Common->ReadBufferAllocator.Free(node);
                return;
            }
        }

        // If duplicating:
        if (LossRNG.Next() < (uint32_t)(0xffffffff * config.DuplicateRate)) {
            dupe = true;
        }

        float reorderRate;
        if (InBurstReorder) {
            reorderRate = 1.f - config.OrderRate;
        }
        else {
            reorderRate = config.ReorderRate;
        }

        // If this packet will be reordered:
        unsigned reorderMsec = 0;
        if (LossRNG.Next() < (uint32_t)(0xffffffff * reorderRate))
        {
            InBurstReorder = true;
            reorderMsec = config.ReorderMinimumLatencyMsec;
            const unsigned range = config.ReorderMaximumLatencyMsec - config.ReorderMinimumLatencyMsec;
            if (range > 0) {
                reorderMsec += LossRNG.Next() % range;
            }
        }
        else {
            InBurstReorder = false;
        }

        // Select loss rate for this packet due to Gilbert-Elliott channel model
        float lossRate;
        if (InBurstLoss) {
            lossRate = 1.f - config.DeliveryRate;
        }
        else {
            lossRate = config.LossRate;
        }

        // If this packet will be lost:
        if (LossRNG.Next() < (uint32_t)(0xffffffff * lossRate)) {
            InBurstLoss = true;
            Common->ReadBufferAllocator.Free(node);
            return;
        }
        InBurstLoss = false; // Burst loss is done

        // If this packet will be corrupted:
        if (LossRNG.Next() < (uint32_t)(0xffffffff * config.CorruptionRate)) {
            node->Data[LossRNG.Next() % node->Bytes] ^= 8;
        }

        // If re-ordered:
        if (reorderMsec > 0) {
            // Add reorder time to it
            // Note: Bypasses queue so will not be counted towards channel bandwidth
            deliveryUsec += reorderMsec * 1000;
        }
        else {
            // It takes up a queue slot, so advance the queue
            NextQueueSlotUsec = deliveryUsec;
        }

        node->DeliveryUsec = deliveryUsec;
    }

    // Hold QueueLock during queue insert
    {
        Locker locker(QueueLock);
        Queue.InsertSorted(node);
    }

    if (dupe)
    {
        // Allocate space for the duplicate
        uint8_t* readBuffer = Common->ReadBufferAllocator.Allocate(kQueueHeaderSize + node->Bytes);

        QueueNode* dupeNode = reinterpret_cast<QueueNode*>(readBuffer);

        // Copy the data
        dupeNode->Bytes = node->Bytes;
        memcpy(&dupeNode->Data[0], &node->Data[0], node->Bytes);

        InsertQueueNode(dupeNode);
    }

    postNextTimer();
}